

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm_encode_main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  code *pcVar3;
  long *plVar4;
  pointer pbVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  value_type *__x;
  int *piVar10;
  uint *puVar11;
  char *pcVar12;
  ostream *poVar13;
  undefined8 *puVar14;
  undefined4 *puVar15;
  double *pdVar16;
  SentencePieceProcessor *pSVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  string *psVar19;
  pointer pbVar20;
  pointer __lhs;
  int i;
  basic_string_view<char,_std::char_traits<char>_> __args;
  undefined1 auVar21 [16];
  _Any_data local_368;
  code *local_358;
  code *pcStack_350;
  ScopedResourceDestructor cleaner;
  int nbest_size;
  _Any_data local_338;
  code *local_328;
  code *pcStack_320;
  float alpha;
  long *local_308;
  int argc_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rest_args;
  flat_hash_map<std::string,_int> vocab;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_2a0;
  NBestSentencePieceText nbest_spt;
  vector<int,_std::allocator<int>_> ids;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sps;
  char **argv_local;
  SentencePieceText spt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  nbest_ids;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  nbest_sps;
  string line;
  SentencePieceProcessor sp;
  Status _status_4;
  _Any_data __tmp;
  _Any_data __tmp_1;
  _Any_data __tmp_2;
  _Any_data __tmp_3;
  _Any_data __tmp_4;
  _Any_data __tmp_5;
  _Any_data __tmp_6;
  _Any_data __tmp_7;
  _Any_data __tmp_8;
  
  argc_local = argc;
  argv_local = argv;
  sentencepiece::ParseCommandLineFlags(*argv,&argc_local,&argv_local,true);
  rest_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rest_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rest_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = absl::Flag<std::__cxx11::string>::value();
  if (*(long *)(lVar9 + 8) == 0) {
    for (lVar9 = 1; lVar9 < argc_local; lVar9 = lVar9 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sp,argv_local[lVar9],(allocator<char> *)&spt);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rest_args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sp);
      std::__cxx11::string::~string((string *)&sp);
    }
  }
  else {
    __x = (value_type *)absl::Flag<std::__cxx11::string>::value();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&rest_args,__x);
  }
  piVar10 = (int *)absl::Flag<unsigned_int>::value();
  if (*piVar10 != -1) {
    puVar11 = (uint *)absl::Flag<unsigned_int>::value();
    sentencepiece::SetRandomGeneratorSeed(*puVar11);
  }
  if (rest_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      rest_args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&sp,"",(allocator<char> *)&spt);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rest_args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sp);
    std::__cxx11::string::~string((string *)&sp);
  }
  lVar9 = absl::Flag<std::__cxx11::string>::value();
  if (*(long *)(lVar9 + 8) == 0) {
    sp = (SentencePieceProcessor)0x1;
    pcVar12 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
    poVar13 = std::operator<<((ostream *)&std::cerr,pcVar12);
    poVar13 = std::operator<<(poVar13,"(");
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0x4a);
    poVar13 = std::operator<<(poVar13,") [");
    poVar13 = std::operator<<(poVar13,"!absl::GetFlag(FLAGS_model).empty()");
    std::operator<<(poVar13,"] ");
    sentencepiece::error::Die::~Die((Die *)&sp);
  }
  sentencepiece::SentencePieceProcessor::SentencePieceProcessor(&sp);
  puVar14 = (undefined8 *)absl::Flag<std::__cxx11::string>::value();
  sentencepiece::SentencePieceProcessor::Load(&vocab,&sp,puVar14[1],*puVar14);
  if (vocab._M_h._M_buckets != (__buckets_ptr)0x0) {
    nbest_spt = (NBestSentencePieceText)0x1;
    pcVar12 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
    poVar13 = std::operator<<((ostream *)&std::cerr,pcVar12);
    poVar13 = std::operator<<(poVar13,"(");
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0x4d);
    poVar13 = std::operator<<(poVar13,") [");
    poVar13 = std::operator<<(poVar13,"_status.ok()");
    poVar13 = std::operator<<(poVar13,"] ");
    sentencepiece::util::Status::ToString_abi_cxx11_();
    std::operator<<(poVar13,(string *)&spt);
    std::__cxx11::string::~string((string *)&spt);
    sentencepiece::error::Die::~Die((Die *)&nbest_spt);
  }
  sentencepiece::util::Status::~Status((Status *)&vocab);
  puVar14 = (undefined8 *)absl::Flag<std::__cxx11::string>::value();
  sentencepiece::SentencePieceProcessor::SetEncodeExtraOptions(&vocab,&sp,puVar14[1],*puVar14);
  if (vocab._M_h._M_buckets != (__buckets_ptr)0x0) {
    nbest_spt = (NBestSentencePieceText)0x1;
    pcVar12 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
    poVar13 = std::operator<<((ostream *)&std::cerr,pcVar12);
    poVar13 = std::operator<<(poVar13,"(");
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0x4e);
    poVar13 = std::operator<<(poVar13,") [");
    poVar13 = std::operator<<(poVar13,"_status.ok()");
    poVar13 = std::operator<<(poVar13,"] ");
    sentencepiece::util::Status::ToString_abi_cxx11_();
    std::operator<<(poVar13,(string *)&spt);
    std::__cxx11::string::~string((string *)&spt);
    sentencepiece::error::Die::~Die((Die *)&nbest_spt);
  }
  sentencepiece::util::Status::~Status((Status *)&vocab);
  lVar9 = absl::Flag<std::__cxx11::string>::value();
  if (*(long *)(lVar9 + 8) != 0) {
    puVar14 = (undefined8 *)absl::Flag<std::__cxx11::string>::value();
    uVar1 = *puVar14;
    uVar2 = puVar14[1];
    puVar15 = (undefined4 *)absl::Flag<int>::value();
    sentencepiece::SentencePieceProcessor::LoadVocabulary(&vocab,&sp,uVar2,uVar1,*puVar15);
    if (vocab._M_h._M_buckets != (__buckets_ptr)0x0) {
      nbest_spt = (NBestSentencePieceText)0x1;
      pcVar12 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
      poVar13 = std::operator<<((ostream *)&std::cerr,pcVar12);
      poVar13 = std::operator<<(poVar13,"(");
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0x52);
      poVar13 = std::operator<<(poVar13,") [");
      poVar13 = std::operator<<(poVar13,"_status.ok()");
      poVar13 = std::operator<<(poVar13,"] ");
      sentencepiece::util::Status::ToString_abi_cxx11_();
      std::operator<<(poVar13,(string *)&spt);
      std::__cxx11::string::~string((string *)&spt);
      sentencepiece::error::Die::~Die((Die *)&nbest_spt);
    }
    sentencepiece::util::Status::~Status((Status *)&vocab);
  }
  puVar14 = (undefined8 *)absl::Flag<std::__cxx11::string>::value();
  sentencepiece::filesystem::NewWritableFile(&local_308,puVar14[1],*puVar14,0);
  (**(code **)(*local_308 + 0x10))(&vocab);
  if (vocab._M_h._M_buckets != (__buckets_ptr)0x0) {
    nbest_spt = (NBestSentencePieceText)0x1;
    pcVar12 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
    poVar13 = std::operator<<((ostream *)&std::cerr,pcVar12);
    poVar13 = std::operator<<(poVar13,"(");
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0x57);
    poVar13 = std::operator<<(poVar13,") [");
    poVar13 = std::operator<<(poVar13,"_status.ok()");
    poVar13 = std::operator<<(poVar13,"] ");
    sentencepiece::util::Status::ToString_abi_cxx11_();
    std::operator<<(poVar13,(string *)&spt);
    std::__cxx11::string::~string((string *)&spt);
    sentencepiece::error::Die::~Die((Die *)&nbest_spt);
  }
  sentencepiece::util::Status::~Status((Status *)&vocab);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  sps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  nbest_sps.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  nbest_ids.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nbest_sps.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nbest_sps.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  nbest_ids.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nbest_ids.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vocab._M_h._M_buckets = &vocab._M_h._M_single_bucket;
  vocab._M_h._M_bucket_count = 1;
  vocab._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  vocab._M_h._M_element_count = 0;
  vocab._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  vocab._M_h._M_rehash_policy._M_next_resize = 0;
  vocab._M_h._M_single_bucket = (__node_base_ptr)0x0;
  sentencepiece::SentencePieceText::SentencePieceText(&spt);
  sentencepiece::NBestSentencePieceText::NBestSentencePieceText(&nbest_spt);
  local_358 = (code *)0x0;
  pcStack_350 = (code *)0x0;
  local_368._M_unused._M_object = (SentencePieceProcessor *)0x0;
  local_368._8_8_ = (SentencePieceText *)0x0;
  piVar10 = (int *)absl::Flag<int>::value();
  nbest_size = *piVar10;
  pdVar16 = (double *)absl::Flag<double>::value();
  alpha = (float)*pdVar16;
  pcVar12 = (char *)absl::Flag<bool>::value();
  if (*pcVar12 == '\x01') {
    local_328 = (code *)0x0;
    pcStack_320 = (code *)0x0;
    local_338._M_unused._M_object = (void *)0x0;
    local_338._8_8_ = (SentencePieceText *)0x0;
    pSVar17 = (SentencePieceProcessor *)operator_new(0x18);
    uVar1 = local_338._8_8_;
    local_328 = local_358;
    *(SentencePieceProcessor **)pSVar17 = &sp;
    *(SentencePieceText **)(pSVar17 + 8) = &spt;
    *(Status **)(pSVar17 + 0x10) = (Status *)&vocab;
    local_338._M_unused._M_object = local_368._M_unused._M_object;
    local_338._8_8_ = local_368._8_8_;
    local_368._8_8_ = uVar1;
    local_358 = std::
                _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:103:15)>
                ::_M_manager;
    pcStack_320 = pcStack_350;
    pcStack_350 = std::
                  _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:103:15)>
                  ::_M_invoke;
    local_368._M_unused._0_8_ = (undefined8)pSVar17;
  }
  else {
    pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              absl::Flag<std::__cxx11::string>::value();
    bVar6 = std::operator==(pbVar18,"piece");
    if (bVar6) {
      local_328 = (code *)0x0;
      pcStack_320 = (code *)0x0;
      local_338._M_unused._M_object = (void *)0x0;
      local_338._8_8_ = (SentencePieceText *)0x0;
      pSVar17 = (SentencePieceProcessor *)operator_new(0x18);
      uVar1 = local_338._8_8_;
      local_328 = local_358;
      *(SentencePieceProcessor **)pSVar17 = &sp;
      *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        **)(pSVar17 + 8) = &sps;
      *(long ***)(pSVar17 + 0x10) = &local_308;
      local_338._M_unused._M_object = local_368._M_unused._M_object;
      local_338._8_8_ = local_368._8_8_;
      local_368._8_8_ = uVar1;
      local_358 = std::
                  _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:111:15)>
                  ::_M_manager;
      pcStack_320 = pcStack_350;
      pcStack_350 = std::
                    _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:111:15)>
                    ::_M_invoke;
      local_368._M_unused._0_8_ = (undefined8)pSVar17;
    }
    else {
      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                absl::Flag<std::__cxx11::string>::value();
      bVar6 = std::operator==(pbVar18,"id");
      if (bVar6) {
        local_328 = (code *)0x0;
        pcStack_320 = (code *)0x0;
        local_338._M_unused._M_object = (void *)0x0;
        local_338._8_8_ = (SentencePieceText *)0x0;
        pSVar17 = (SentencePieceProcessor *)operator_new(0x18);
        uVar1 = local_338._8_8_;
        local_328 = local_358;
        *(SentencePieceProcessor **)pSVar17 = &sp;
        *(vector<int,_std::allocator<int>_> **)(pSVar17 + 8) = &ids;
        *(long ***)(pSVar17 + 0x10) = &local_308;
        local_338._M_unused._M_object = local_368._M_unused._M_object;
        local_338._8_8_ = local_368._8_8_;
        local_368._8_8_ = uVar1;
        local_358 = std::
                    _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:116:15)>
                    ::_M_manager;
        pcStack_320 = pcStack_350;
        pcStack_350 = std::
                      _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:116:15)>
                      ::_M_invoke;
        local_368._M_unused._0_8_ = (undefined8)pSVar17;
      }
      else {
        pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  absl::Flag<std::__cxx11::string>::value();
        bVar6 = std::operator==(pbVar18,"proto");
        pcVar3 = local_358;
        if (bVar6) {
          local_338._M_unused._M_object = local_368._M_unused._M_object;
          local_338._8_8_ = local_368._8_8_;
          local_358 = std::
                      _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:121:15)>
                      ::_M_manager;
          local_328 = pcVar3;
          pcStack_320 = pcStack_350;
          pcStack_350 = std::
                        _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:121:15)>
                        ::_M_invoke;
          local_368._M_unused._M_object = &sp;
          local_368._8_8_ = &spt;
        }
        else {
          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    absl::Flag<std::__cxx11::string>::value();
          bVar6 = std::operator==(pbVar18,"sample_piece");
          if (bVar6) {
            local_328 = (code *)0x0;
            pcStack_320 = (code *)0x0;
            local_338._M_unused._M_object = (void *)0x0;
            local_338._8_8_ = (SentencePieceText *)0x0;
            pSVar17 = (SentencePieceProcessor *)operator_new(0x28);
            uVar1 = local_338._8_8_;
            local_328 = local_358;
            *(SentencePieceProcessor **)pSVar17 = &sp;
            *(int **)(pSVar17 + 8) = &nbest_size;
            *(float **)(pSVar17 + 0x10) = &alpha;
            *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              **)(pSVar17 + 0x18) = &sps;
            *(long ***)(pSVar17 + 0x20) = &local_308;
            local_338._M_unused._M_object = local_368._M_unused._M_object;
            local_338._8_8_ = local_368._8_8_;
            local_368._8_8_ = uVar1;
            local_358 = std::
                        _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:123:15)>
                        ::_M_manager;
            pcStack_320 = pcStack_350;
            pcStack_350 = std::
                          _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:123:15)>
                          ::_M_invoke;
            local_368._M_unused._0_8_ = (undefined8)pSVar17;
          }
          else {
            pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      absl::Flag<std::__cxx11::string>::value();
            bVar6 = std::operator==(pbVar18,"sample_id");
            if (bVar6) {
              local_328 = (code *)0x0;
              pcStack_320 = (code *)0x0;
              local_338._M_unused._M_object = (void *)0x0;
              local_338._8_8_ = (SentencePieceText *)0x0;
              pSVar17 = (SentencePieceProcessor *)operator_new(0x28);
              uVar1 = local_338._8_8_;
              local_328 = local_358;
              *(SentencePieceProcessor **)pSVar17 = &sp;
              *(int **)(pSVar17 + 8) = &nbest_size;
              *(float **)(pSVar17 + 0x10) = &alpha;
              *(vector<int,_std::allocator<int>_> **)(pSVar17 + 0x18) = &ids;
              *(long ***)(pSVar17 + 0x20) = &local_308;
              local_338._M_unused._M_object = local_368._M_unused._M_object;
              local_338._8_8_ = local_368._8_8_;
              local_368._8_8_ = uVar1;
              local_358 = std::
                          _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:128:15)>
                          ::_M_manager;
              pcStack_320 = pcStack_350;
              pcStack_350 = std::
                            _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:128:15)>
                            ::_M_invoke;
              local_368._M_unused._0_8_ = (undefined8)pSVar17;
            }
            else {
              pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        absl::Flag<std::__cxx11::string>::value();
              bVar6 = std::operator==(pbVar18,"sample_proto");
              if (bVar6) {
                local_328 = (code *)0x0;
                pcStack_320 = (code *)0x0;
                local_338._M_unused._M_object = (void *)0x0;
                local_338._8_8_ = (SentencePieceText *)0x0;
                pSVar17 = (SentencePieceProcessor *)operator_new(0x20);
                uVar1 = local_338._8_8_;
                local_328 = local_358;
                *(SentencePieceProcessor **)pSVar17 = &sp;
                *(int **)(pSVar17 + 8) = &nbest_size;
                *(float **)(pSVar17 + 0x10) = &alpha;
                *(SentencePieceText **)(pSVar17 + 0x18) = &spt;
                local_338._M_unused._M_object = local_368._M_unused._M_object;
                local_338._8_8_ = local_368._8_8_;
                local_368._8_8_ = uVar1;
                local_358 = std::
                            _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:133:15)>
                            ::_M_manager;
                pcStack_320 = pcStack_350;
                pcStack_350 = std::
                              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:133:15)>
                              ::_M_invoke;
                local_368._M_unused._0_8_ = (undefined8)pSVar17;
              }
              else {
                pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          absl::Flag<std::__cxx11::string>::value();
                bVar6 = std::operator==(pbVar18,"nbest_piece");
                if (bVar6) {
                  local_328 = (code *)0x0;
                  pcStack_320 = (code *)0x0;
                  local_338._M_unused._M_object = (void *)0x0;
                  local_338._8_8_ = (SentencePieceText *)0x0;
                  pSVar17 = (SentencePieceProcessor *)operator_new(0x20);
                  uVar1 = local_338._8_8_;
                  local_328 = local_358;
                  *(SentencePieceProcessor **)pSVar17 = &sp;
                  *(int **)(pSVar17 + 8) = &nbest_size;
                  *(vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    **)(pSVar17 + 0x10) = &nbest_sps;
                  *(long ***)(pSVar17 + 0x18) = &local_308;
                  local_338._M_unused._M_object = local_368._M_unused._M_object;
                  local_338._8_8_ = local_368._8_8_;
                  local_368._8_8_ = uVar1;
                  local_358 = std::
                              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:137:15)>
                              ::_M_manager;
                  pcStack_320 = pcStack_350;
                  pcStack_350 = std::
                                _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:137:15)>
                                ::_M_invoke;
                  local_368._M_unused._0_8_ = (undefined8)pSVar17;
                }
                else {
                  pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            absl::Flag<std::__cxx11::string>::value();
                  bVar6 = std::operator==(pbVar18,"nbest_id");
                  if (bVar6) {
                    local_328 = (code *)0x0;
                    pcStack_320 = (code *)0x0;
                    local_338._M_unused._M_object = (void *)0x0;
                    local_338._8_8_ = (SentencePieceText *)0x0;
                    pSVar17 = (SentencePieceProcessor *)operator_new(0x20);
                    uVar1 = local_338._8_8_;
                    local_328 = local_358;
                    *(SentencePieceProcessor **)pSVar17 = &sp;
                    *(int **)(pSVar17 + 8) = &nbest_size;
                    *(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      **)(pSVar17 + 0x10) = &nbest_ids;
                    *(long ***)(pSVar17 + 0x18) = &local_308;
                    local_338._M_unused._M_object = local_368._M_unused._M_object;
                    local_338._8_8_ = local_368._8_8_;
                    local_368._8_8_ = uVar1;
                    local_358 = std::
                                _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:144:15)>
                                ::_M_manager;
                    pcStack_320 = pcStack_350;
                    pcStack_350 = std::
                                  _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:144:15)>
                                  ::_M_invoke;
                    local_368._M_unused._0_8_ = (undefined8)pSVar17;
                  }
                  else {
                    pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              absl::Flag<std::__cxx11::string>::value();
                    bVar6 = std::operator==(pbVar18,"nbest_proto");
                    if (!bVar6) {
                      iVar8 = sentencepiece::logging::GetMinLogLevel();
                      if (iVar8 < 4) {
                        local_338._M_pod_data[0] = 1;
                        pcVar12 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
                        poVar13 = std::operator<<((ostream *)&std::cerr,pcVar12);
                        poVar13 = std::operator<<(poVar13,"(");
                        poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0x9b);
                        poVar13 = std::operator<<(poVar13,") ");
                        poVar13 = std::operator<<(poVar13,"LOG(");
                        poVar13 = std::operator<<(poVar13,"FATAL");
                        poVar13 = std::operator<<(poVar13,") ");
                        poVar13 = std::operator<<(poVar13,"Unknown output format: ");
                        psVar19 = (string *)absl::Flag<std::__cxx11::string>::value();
                        std::operator<<(poVar13,psVar19);
                        sentencepiece::error::Die::~Die((Die *)local_338._M_pod_data);
                      }
                      goto LAB_001055fb;
                    }
                    local_328 = (code *)0x0;
                    pcStack_320 = (code *)0x0;
                    local_338._M_unused._M_object = (void *)0x0;
                    local_338._8_8_ = (SentencePieceText *)0x0;
                    pSVar17 = (SentencePieceProcessor *)operator_new(0x18);
                    uVar1 = local_338._8_8_;
                    local_328 = local_358;
                    *(SentencePieceProcessor **)pSVar17 = &sp;
                    *(int **)(pSVar17 + 8) = &nbest_size;
                    *(NBestSentencePieceText **)(pSVar17 + 0x10) = &nbest_spt;
                    local_338._M_unused._M_object = local_368._M_unused._M_object;
                    local_338._8_8_ = local_368._8_8_;
                    local_368._8_8_ = uVar1;
                    local_358 = std::
                                _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:151:15)>
                                ::_M_manager;
                    pcStack_320 = pcStack_350;
                    pcStack_350 = std::
                                  _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]sentencepiece/src/spm_encode_main.cc:151:15)>
                                  ::_M_invoke;
                    local_368._M_unused._0_8_ = (undefined8)pSVar17;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_338);
LAB_001055fb:
  pbVar5 = rest_args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar20 = rest_args.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar5; pbVar20 = pbVar20 + 1
      ) {
    sentencepiece::filesystem::NewReadableFile
              (&local_1b8,pbVar20->_M_string_length,(pbVar20->_M_dataplus)._M_p,0);
    (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 0x10))(&_status_4);
    if (__status_4 != (pointer)0x0) {
      local_2a0.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
      pcVar12 = sentencepiece::logging::BaseName("src/spm_encode_main.cc");
      poVar13 = std::operator<<((ostream *)&std::cerr,pcVar12);
      poVar13 = std::operator<<(poVar13,"(");
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,0xa1);
      poVar13 = std::operator<<(poVar13,") [");
      poVar13 = std::operator<<(poVar13,"_status.ok()");
      poVar13 = std::operator<<(poVar13,"] ");
      sentencepiece::util::Status::ToString_abi_cxx11_();
      std::operator<<(poVar13,(string *)local_338._M_pod_data);
      std::__cxx11::string::~string((string *)local_338._M_pod_data);
      sentencepiece::error::Die::~Die((Die *)&local_2a0);
    }
    sentencepiece::util::Status::~Status(&_status_4);
    while( true ) {
      cVar7 = (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 0x18))
                        (local_1b8._M_dataplus._M_p,&line);
      if (cVar7 == '\0') break;
      __args._M_str = line._M_dataplus._M_p;
      __args._M_len = line._M_string_length;
      std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)
                 &local_368,__args);
    }
    if ((long *)local_1b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))();
    }
  }
  auVar21 = absl::Flag<bool>::value();
  if (*auVar21._0_8_ == '\x01') {
    sentencepiece::Sorted<std::__cxx11::string,int>
              (&local_2a0,(sentencepiece *)&vocab,auVar21._8_8_);
    for (__lhs = (pointer)CONCAT71(local_2a0.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_2a0.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_);
        plVar4 = local_308,
        __lhs != local_2a0.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      std::operator+(&local_1b8,&__lhs->first,"\t");
      sentencepiece::string_util::SimpleItoa<int>((string *)&_status_4,__lhs->second);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_338
                     ,&local_1b8,(string *)&_status_4);
      (**(code **)(*plVar4 + 0x20))(plVar4,local_338._8_8_,local_338._M_unused._M_object);
      std::__cxx11::string::~string((string *)local_338._M_pod_data);
      std::__cxx11::string::~string((string *)&_status_4);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~vector(&local_2a0);
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_368);
  sentencepiece::NBestSentencePieceText::~NBestSentencePieceText(&nbest_spt);
  sentencepiece::SentencePieceText::~SentencePieceText(&spt);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&vocab._M_h);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&nbest_ids);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&nbest_sps);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ids.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sps);
  std::__cxx11::string::~string((string *)&line);
  if (local_308 != (long *)0x0) {
    (**(code **)(*local_308 + 8))();
  }
  sentencepiece::SentencePieceProcessor::~SentencePieceProcessor(&sp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&rest_args);
  sentencepiece::ScopedResourceDestructor::~ScopedResourceDestructor(&cleaner);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  sentencepiece::ScopedResourceDestructor cleaner;
  sentencepiece::ParseCommandLineFlags(argv[0], &argc, &argv, true);
  std::vector<std::string> rest_args;

  if (absl::GetFlag(FLAGS_input).empty()) {
    for (int i = 1; i < argc; ++i) {
      rest_args.push_back(std::string(argv[i]));
    }
  } else {
    rest_args.push_back(absl::GetFlag(FLAGS_input));
  }

  if (absl::GetFlag(FLAGS_random_seed) != -1) {
    sentencepiece::SetRandomGeneratorSeed(absl::GetFlag(FLAGS_random_seed));
  }

  if (rest_args.empty())
    rest_args.push_back("");  // empty means that reading from stdin.

  CHECK(!absl::GetFlag(FLAGS_model).empty());

  sentencepiece::SentencePieceProcessor sp;
  CHECK_OK(sp.Load(absl::GetFlag(FLAGS_model)));
  CHECK_OK(sp.SetEncodeExtraOptions(absl::GetFlag(FLAGS_extra_options)));

  if (!absl::GetFlag(FLAGS_vocabulary).empty()) {
    CHECK_OK(sp.LoadVocabulary(absl::GetFlag(FLAGS_vocabulary),
                               absl::GetFlag(FLAGS_vocabulary_threshold)));
  }

  auto output =
      sentencepiece::filesystem::NewWritableFile(absl::GetFlag(FLAGS_output));
  CHECK_OK(output->status());

  std::string line;
  std::vector<std::string> sps;
  std::vector<int> ids;
  std::vector<std::vector<std::string>> nbest_sps;
  std::vector<std::vector<int>> nbest_ids;
  absl::flat_hash_map<std::string, int> vocab;
  sentencepiece::SentencePieceText spt;
  sentencepiece::NBestSentencePieceText nbest_spt;
  std::function<void(absl::string_view line)> process;

  const int nbest_size = absl::GetFlag(FLAGS_nbest_size);
  const float alpha = absl::GetFlag(FLAGS_alpha);

  if (absl::GetFlag(FLAGS_generate_vocabulary)) {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.Encode(line, &spt));
      for (const auto &piece : spt.pieces()) {
        if (!sp.IsUnknown(piece.id()) && !sp.IsControl(piece.id()))
          vocab[piece.piece()]++;
      }
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "piece") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.Encode(line, &sps));
      output->WriteLine(absl::StrJoin(sps, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "id") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.Encode(line, &ids));
      output->WriteLine(absl::StrJoin(ids, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "proto") {
    process = [&](absl::string_view line) { CHECK_OK(sp.Encode(line, &spt)); };
  } else if (absl::GetFlag(FLAGS_output_format) == "sample_piece") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.SampleEncode(line, nbest_size, alpha, &sps));
      output->WriteLine(absl::StrJoin(sps, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "sample_id") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.SampleEncode(line, nbest_size, alpha, &ids));
      output->WriteLine(absl::StrJoin(ids, " "));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "sample_proto") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.SampleEncode(line, nbest_size, alpha, &spt));
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "nbest_piece") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.NBestEncode(line, nbest_size, &nbest_sps));
      for (const auto &result : nbest_sps) {
        output->WriteLine(absl::StrJoin(result, " "));
      }
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "nbest_id") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.NBestEncode(line, nbest_size, &nbest_ids));
      for (const auto &result : nbest_ids) {
        output->WriteLine(absl::StrJoin(result, " "));
      }
    };
  } else if (absl::GetFlag(FLAGS_output_format) == "nbest_proto") {
    process = [&](absl::string_view line) {
      CHECK_OK(sp.NBestEncode(line, nbest_size, &nbest_spt));
    };
  } else {
    LOG(FATAL) << "Unknown output format: "
               << absl::GetFlag(FLAGS_output_format);
  }

  for (const auto &filename : rest_args) {
    auto input = sentencepiece::filesystem::NewReadableFile(filename);
    CHECK_OK(input->status());
    while (input->ReadLine(&line)) {
      process(line);
    }
  }

  if (absl::GetFlag(FLAGS_generate_vocabulary)) {
    for (const auto &it : sentencepiece::Sorted(vocab)) {
      output->WriteLine(it.first + "\t" +
                        sentencepiece::string_util::SimpleItoa(it.second));
    }
  }

  return 0;
}